

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

int __thiscall
Jupiter::IRC::Client::think::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,int error_code)

{
  Client *this_00;
  long lVar1;
  time_t tVar2;
  int error_code_local;
  anon_class_8_1_8991fb9c *this_local;
  
  this_00 = this->this;
  this_local._4_4_ = error_code;
  if (((this_00->m_dead & 1U) != 1) &&
     ((this_00->m_max_reconnect_attempts < 0 ||
      (this_00->m_reconnect_attempts < this_00->m_max_reconnect_attempts)))) {
    if ((this_00->m_reconnect_delay == 0) ||
       (lVar1 = this_00->m_reconnect_time, tVar2 = time((time_t *)0x0), lVar1 < tVar2)) {
      reconnect(this_00);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Jupiter::IRC::Client::think() {
	auto handle_error = [this](int error_code) {
		if (this->m_dead == true)
			return error_code;

		if (this->m_max_reconnect_attempts < 0 || this->m_reconnect_attempts < this->m_max_reconnect_attempts) {
			if (!this->m_reconnect_delay || this->m_reconnect_time < time(0))
				this->reconnect();

			return 0;
		}

		return error_code;
	};

	if (m_connection_status == 0)
		return handle_error(-1);

	int tmp = m_socket->recv();
	if (tmp > 0) {
		// Process incoming data
		using namespace std::literals;
		auto tokens = jessilib::split_view(m_socket->getBuffer(), "\r\n"sv);
		if (tokens.size() != 0) {
			if (tokens[0].size() > 0) {
				// Ensure there's not a token getting split over separate buffers
				std::string_view token_0 = tokens[0];
				if (m_last_line.size() > 0) {
					if (tokens[0][0] == '\n' && m_last_line[m_last_line.size() - 1] == '\r') {
						m_last_line.pop_back();
						Jupiter::IRC::Client::process_line(m_last_line);
						m_last_line.erase();

						token_0.remove_prefix(1);
					}
				}

				m_last_line += token_0;
			}

			if (tokens.size() != 1) {
				Jupiter::IRC::Client::process_line(m_last_line);
				m_last_line = tokens[tokens.size() - 1];

				for (size_t index = 1; index != tokens.size() - 1; ++index) {
					if (Jupiter::IRC::Client::process_line(tokens[index]) != 0) {
						return handle_error(1);
					}
				}
			}
		}

		return 0;
	}

	// No incoming data; check for errors
	tmp = m_socket->getLastError();

	if (tmp == JUPITER_SOCK_EWOULDBLOCK) // Operation would block
		return 0;

	// Serious error; disconnect if necessary
	if (m_connection_status != 0)
		Jupiter::IRC::Client::disconnect();

	return handle_error(tmp);
}